

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

ostream * tcu::operator<<(ostream *str,ConstPixelBufferAccess *access)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(str,"format = (",10);
  operator<<(str,access->m_format);
  std::__ostream_insert<char,std::char_traits<char>>(str,"), size = ",10);
  poVar1 = (ostream *)std::ostream::operator<<(str,(access->m_size).m_data[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," x ",3);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(access->m_size).m_data[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," x ",3);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(access->m_size).m_data[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", pitch = ",10);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(access->m_pitch).m_data[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," / ",3);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(access->m_pitch).m_data[2]);
  return poVar1;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const ConstPixelBufferAccess& access)
{
	return str << "format = (" << access.getFormat() << "), size = "
			   << access.getWidth() << " x " << access.getHeight() << " x " << access.getDepth()
			   << ", pitch = " << access.getRowPitch() << " / " << access.getSlicePitch();
}